

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::
ConstructMessage<std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          unsigned_long params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          unsigned_long params_3,unsigned_long params_4)

{
  pointer pcVar1;
  pointer params_3_00;
  undefined1 local_78 [16];
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  params_3_00 = (pointer)local_78;
  pcVar1 = (msg->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff78,pcVar1,pcVar1 + msg->_M_string_length);
  local_50._M_allocated_capacity = (size_type)local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,*(long *)params_1,*(long *)(params_1 + 8) + *(long *)params_1);
  ConstructMessageRecursive<std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,unsigned_long>
            (__return_storage_ptr__,this,(string *)&values,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             &stack0xffffffffffffff78,params,(unsigned_long)&local_50,params_2,params_3,
             (unsigned_long)params_3_00);
  if ((undefined1 *)local_50._0_8_ != local_40) {
    operator_delete((void *)local_50._0_8_);
  }
  if (params_3_00 != (pointer)local_78) {
    operator_delete(params_3_00);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector(&values);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}